

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.hpp
# Opt level: O0

pair<long,_float> __thiscall
re::beatnik::viterbi<float,_256L>::max_delta_element(viterbi<float,_256L> *this,int_t permutation)

{
  float fVar1;
  const_reference pvVar2;
  float fVar3;
  pair<long,_float> pVar4;
  pair<int,_float> local_40;
  float local_38;
  float local_34;
  float product;
  int i;
  int max_index;
  float max_value;
  int_t permutation_local;
  viterbi<float,_256L> *this_local;
  undefined4 local_10;
  
  _max_index = permutation;
  permutation_local = (int_t)this;
  pvVar2 = std::array<float,_256UL>::operator[](&this->delta,0);
  fVar1 = *pvVar2;
  fVar3 = at(this,_max_index,0);
  i = (int)(fVar1 * fVar3);
  product = 0.0;
  for (local_34 = 0.0; (int)local_34 < 0x100; local_34 = (float)((int)local_34 + 1)) {
    pvVar2 = std::array<float,_256UL>::operator[](&this->delta,(long)(int)local_34);
    fVar1 = *pvVar2;
    local_38 = at(this,(long)(int)local_34,_max_index);
    local_38 = fVar1 * local_38;
    if ((float)i < local_38) {
      product = local_34;
      i = (int)local_38;
    }
  }
  local_40 = ::std::make_pair<int&,float&>((int *)&product,(float *)&i);
  std::pair<long,_float>::pair<int,_float,_true>((pair<long,_float> *)&this_local,&local_40);
  pVar4._12_4_ = 0;
  pVar4.first = (long)this_local;
  pVar4.second = (float)local_10;
  return pVar4;
}

Assistant:

std::pair<int_t, T>
    max_delta_element(int_t permutation) const noexcept
    {
        T max_value = delta[0] * at(permutation, 0);
        int max_index = 0;
        for (auto i = 0; i < N; ++i) {
            auto product = delta[i] * at(i, permutation);
            if (product > max_value) {
                max_index = i;
                max_value = product;
            }
        }
        return std::make_pair(max_index, max_value);
    }